

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZArc3D::ComputeR2Points
          (TPZArc3D *this,TPZFMatrix<double> *coord,double *xa,double *ya,double *xb,double *yb)

{
  TPZFMatrix<double> *coord_00;
  long lVar1;
  long lVar2;
  TPZArc3D *this_00;
  long lVar3;
  double dVar4;
  TPZManVector<double,_3> Temp;
  TPZManVector<double,_3> Axe;
  double local_a8;
  undefined1 local_a0 [64];
  double *local_60;
  
  local_a0._0_8_ = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)(local_a0 + 0x38),3,(double *)local_a0);
  local_a8 = 0.0;
  TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_a0,3,&local_a8);
  lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar3 = 0;
  while( true ) {
    lVar2 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar2 < 1 || lVar1 <= lVar3) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((lVar1 <= lVar3) || (lVar2 < 3)) break;
    local_60[lVar3] = coord->fElem[lVar3] - coord->fElem[lVar1 * 2 + lVar3];
    lVar3 = lVar3 + 1;
    if (lVar3 == 3) {
      lVar1 = (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fRow;
      lVar3 = 0;
      do {
        lVar2 = 0;
        do {
          if ((lVar1 <= lVar3) ||
             ((this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar2)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(double *)(local_a0._8_8_ + lVar3 * 8) =
               (this->fICnBase).super_TPZFMatrix<double>.fElem[lVar1 * lVar2 + lVar3] *
               local_60[lVar2] + *(double *)(local_a0._8_8_ + lVar3 * 8);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      *xa = *(double *)local_a0._8_8_;
      *ya = *(double *)(local_a0._8_8_ + 8);
      local_a8 = 0.0;
      this_00 = (TPZArc3D *)local_a0;
      TPZVec<double>::Fill((TPZVec<double> *)this_00,&local_a8,0,-1);
      lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar3 = 0;
      while( true ) {
        lVar2 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
        if (lVar2 < 2 || lVar1 <= lVar3) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        coord_00 = (TPZFMatrix<double> *)(coord->fElem + lVar1);
        if ((lVar1 <= lVar3) || (lVar2 < 3)) break;
        local_60[lVar3] =
             *(double *)
              ((long)&((TPZFMatrix<double> *)
                      (&((TPZFMatrix<double> *)
                        (&((TPZFMatrix<double> *)(&coord_00->fPivot + -1))->fPivot + -1))->fPivot +
                      -1))->fPivot + lVar3 * 8 + 0xffffffffffffffc8U) -
             coord->fElem[lVar1 * 2 + lVar3];
        lVar3 = lVar3 + 1;
        if (lVar3 == 3) {
          lVar1 = (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                  super_TPZBaseMatrix.fRow;
          lVar3 = 0;
          do {
            lVar2 = 0;
            do {
              if ((lVar1 <= lVar3) ||
                 ((this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                  super_TPZBaseMatrix.fCol <= lVar2)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(double *)(local_a0._8_8_ + lVar3 * 8) =
                   (this->fICnBase).super_TPZFMatrix<double>.fElem[lVar1 * lVar2 + lVar3] *
                   local_60[lVar2] + *(double *)(local_a0._8_8_ + lVar3 * 8);
              lVar2 = lVar2 + 1;
            } while (lVar2 != 3);
            lVar3 = lVar3 + 1;
            if (lVar3 == 3) {
              *xb = *(double *)local_a0._8_8_;
              dVar4 = *(double *)(local_a0._8_8_ + 8);
              *yb = dVar4;
              dVar4 = ArcAngle(this_00,coord_00,*xa,*ya,*xb,dVar4);
              this->fAngle = dVar4;
              TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_a0);
              TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)(local_a0 + 0x38));
              return;
            }
          } while( true );
        }
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZArc3D::ComputeR2Points(TPZFMatrix<REAL> &coord, double &xa, double &ya, double &xb, double &yb)
{
	/** vector (ini - middle) written in new R2 base */
	TPZManVector<REAL,3> Axe(3,0.), Temp(3,0.);
	int i, j;
	for(i = 0; i < 3; i++) Axe[i] = coord(i,0) - coord(i,2);
	for(i = 0; i < 3; i++)
	{
		for(j = 0; j < 3; j++) Temp[i] += fICnBase(i,j)*Axe[j];
	}
	xa = Temp[0]; ya = Temp[1];
	Temp.Fill(0.);
	
	/** vector (final - middle) written in new R2 base */
	for(i = 0; i < 3; i++) Axe[i] = coord(i,1) - coord(i,2);
	for(i = 0; i < 3; i++)
	{
		for(j = 0; j < 3; j++) Temp[i] += fICnBase(i,j)*Axe[j];
	}
	xb = Temp[0]; yb = Temp[1];
	
	fAngle = ArcAngle(coord,xa, ya, xb, yb);
}